

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

void tinyusdz::tydra::anon_unknown_0::detail::DumpSkelNode
               (stringstream *ss,SkelNode *node,uint32_t indent)

{
  pointer pSVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar7;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  uint32_t extraout_EDX_06;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  uint32_t extraout_EDX_09;
  uint32_t extraout_EDX_10;
  uint32_t extraout_EDX_11;
  uint32_t extraout_EDX_12;
  uint32_t extraout_EDX_13;
  uint32_t extraout_EDX_14;
  uint32_t extraout_EDX_15;
  uint32_t extraout_EDX_16;
  uint32_t extraout_EDX_17;
  uint32_t extraout_EDX_18;
  uint32_t extraout_EDX_19;
  uint32_t extraout_EDX_20;
  uint32_t extraout_EDX_21;
  matrix4d *v;
  matrix4d *v_00;
  uint uVar8;
  SkelNode *child;
  pointer node_00;
  string local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  ostream *local_a0;
  string local_98;
  pprint *local_78;
  string local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  poVar5 = (ostream *)(ss + 0x10);
  pprint::Indent_abi_cxx11_(&local_e0,(pprint *)(ulong)indent,indent);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(node->joint_name)._M_dataplus._M_p,(node->joint_name)._M_string_length
                     );
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," {\n",3);
  uVar7 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    uVar7 = extraout_EDX_00;
  }
  uVar8 = indent + 1;
  local_78 = (pprint *)(ulong)indent;
  pprint::Indent_abi_cxx11_(&local_70,(pprint *)(ulong)uVar8,uVar7);
  local_a0 = poVar5;
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_70._M_dataplus._M_p,local_70._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"joint_path ",0xb);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"\"","");
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_98._M_dataplus._M_p,
             local_98._M_dataplus._M_p + local_98._M_string_length);
  ::std::__cxx11::string::_M_append((char *)&local_e0,(ulong)(node->joint_path)._M_dataplus._M_p);
  plVar4 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)local_98._M_dataplus._M_p);
  poVar5 = local_a0;
  local_c0 = &local_b0;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_b0 = *plVar6;
    lStack_a8 = plVar4[3];
  }
  else {
    local_b0 = *plVar6;
    local_c0 = (long *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_c0,local_b8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  uVar7 = extraout_EDX_01;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
    uVar7 = extraout_EDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    uVar7 = extraout_EDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    uVar7 = extraout_EDX_04;
  }
  pprint::Indent_abi_cxx11_(&local_e0,(pprint *)(ulong)uVar8,uVar7);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"joint_id ",9);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,node->joint_id);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  uVar7 = extraout_EDX_05;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    uVar7 = extraout_EDX_06;
  }
  pprint::Indent_abi_cxx11_(&local_70,(pprint *)(ulong)uVar8,uVar7);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_70._M_dataplus._M_p,local_70._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"bind_transform ",0xf);
  tinyusdz::to_string_abi_cxx11_(&local_98,(tinyusdz *)&node->bind_transform,v);
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\"","");
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_50,local_48 + (long)local_50);
  ::std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_98._M_dataplus._M_p);
  plVar4 = (long *)::std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_50);
  poVar5 = local_a0;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_b0 = *plVar6;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar6;
    local_c0 = (long *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_c0,local_b8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  uVar7 = extraout_EDX_07;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
    uVar7 = extraout_EDX_08;
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
    uVar7 = extraout_EDX_09;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    uVar7 = extraout_EDX_10;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    uVar7 = extraout_EDX_11;
  }
  pprint::Indent_abi_cxx11_(&local_70,(pprint *)(ulong)uVar8,uVar7);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_70._M_dataplus._M_p,local_70._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"rest_transform ",0xf);
  tinyusdz::to_string_abi_cxx11_(&local_98,(tinyusdz *)&node->rest_transform,v_00);
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\"","");
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_50,local_48 + (long)local_50);
  ::std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_98._M_dataplus._M_p);
  plVar4 = (long *)::std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_50);
  poVar5 = local_a0;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_b0 = *plVar6;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar6;
    local_c0 = (long *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_c0,local_b8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  uVar7 = extraout_EDX_12;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
    uVar7 = extraout_EDX_13;
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
    uVar7 = extraout_EDX_14;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    uVar7 = extraout_EDX_15;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    uVar7 = extraout_EDX_16;
  }
  if ((node->children).
      super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (node->children).
      super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_e0,(pprint *)(ulong)uVar8,uVar7);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"children {\n",0xb);
    uVar7 = extraout_EDX_17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      uVar7 = extraout_EDX_18;
    }
    node_00 = (node->children).
              super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (node->children).
             super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (node_00 != pSVar1) {
      iVar2 = (int)local_78;
      do {
        DumpSkelNode(ss,node_00,iVar2 + 2);
        node_00 = node_00 + 1;
        uVar7 = extraout_EDX_19;
      } while (node_00 != pSVar1);
    }
    pprint::Indent_abi_cxx11_(&local_e0,(pprint *)(ulong)uVar8,uVar7);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
    uVar7 = extraout_EDX_20;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      uVar7 = extraout_EDX_21;
    }
  }
  pprint::Indent_abi_cxx11_(&local_e0,local_78,uVar7);
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DumpSkelNode(std::stringstream &ss, const SkelNode &node, uint32_t indent) {

  ss << pprint::Indent(indent) << node.joint_name << " {\n";

  ss << pprint::Indent(indent + 1) << "joint_path " << quote(node.joint_path) << "\n";
  ss << pprint::Indent(indent + 1) << "joint_id " << node.joint_id << "\n";
  ss << pprint::Indent(indent + 1) << "bind_transform " << quote(tinyusdz::to_string(node.bind_transform)) << "\n";
  ss << pprint::Indent(indent + 1) << "rest_transform " << quote(tinyusdz::to_string(node.rest_transform)) << "\n";

  if (node.children.size()) {
    ss << pprint::Indent(indent + 1) << "children {\n";
    for (const auto &child : node.children) {
      DumpSkelNode(ss, child, indent + 2);
    }
    ss << pprint::Indent(indent + 1) << "}\n";
  }

  ss << pprint::Indent(indent) << "}\n";
}